

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addUniShapeConversion
          (TIntermediate *this,TOperator op,TType *type,TIntermTyped *node)

{
  EShSource EVar1;
  int iVar2;
  TIntermTyped *node_local;
  TType *type_local;
  TOperator op_local;
  TIntermediate *this_local;
  
  EVar1 = getSource(this);
  this_local = (TIntermediate *)node;
  if (((EVar1 != EShSourceGlsl) && (EVar1 == EShSourceHlsl)) &&
     (((op == EOpFunctionCall || (((op == EOpMix || (op == EOpReturn)) || (op == EOpAssign)))) ||
      ((((op - EOpAddAssign < 3 || (op == EOpDivAssign)) || (op - EOpAndAssign < 5)) &&
       (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(), iVar2 != 1)))))) {
    this_local = (TIntermediate *)addShapeConversion(this,type,node);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TIntermediate::addUniShapeConversion(TOperator op, const TType& type, TIntermTyped* node)
{
    // some source languages don't do this
    switch (getSource()) {
    case EShSourceHlsl:
        break;
    case EShSourceGlsl:
    default:
        return node;
    }

    // some operations don't do this
    switch (op) {
    case EOpFunctionCall:
    case EOpReturn:
        break;

    case EOpMulAssign:
        // want to support vector *= scalar native ops in AST and lower, not smear, similarly for
        // matrix *= scalar, etc.

    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:
        if (node->getVectorSize() == 1)
            return node;
        break;

    case EOpAssign:
        break;

    case EOpMix:
        break;

    default:
        return node;
    }

    return addShapeConversion(type, node);
}